

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bind.cpp
# Opt level: O2

void __thiscall lambda_bind_mem_fn_smart_ptr_Test::TestBody(lambda_bind_mem_fn_smart_ptr_Test *this)

{
  AssertionResult *pAVar1;
  AssertionResult *this_00;
  char *pcVar2;
  AssertHelper local_88;
  AssertionResult gtest_ar_1;
  int local_6c [3];
  AssertionResult gtest_ar;
  __shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined8 local_40;
  undefined4 local_38;
  int local_2c;
  shared_ptr<Thing> thing;
  
  std::make_shared<Thing>();
  gtest_ar_1._0_8_ = Thing::fn;
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_6c[0] = 1;
  local_6c[1] = 2;
  local_6c[2] = 3;
  local_88.data_._0_4_ =
       lambda::invoke<int(Thing::*const&)(int,int,int),std::shared_ptr<Thing>&,int,int,int>
                 ((offset_in_Thing_to_subr *)&gtest_ar_1,&thing,local_6c,local_6c + 1,local_6c + 2);
  local_2c = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"lmd::bind(&Thing::fn)(thing, 1, 2, 3)","6",(int *)&local_88,
             &local_2c);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_1);
    pAVar1 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    this_00 = &gtest_ar_1;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar._0_8_ = Thing::fn;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&thing.super___shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>);
    local_6c[0] = 1;
    local_6c[1] = 2;
    local_6c[2] = 3;
    local_88.data_._0_4_ =
         lambda::
         bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&)
         ::{lambda((auto:1&&)...)#1}::operator()
                   ((_lambda__auto_1________1_ *)&gtest_ar,local_6c,local_6c + 1,local_6c + 2);
    local_2c = 6;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_1,"lmd::bind(&Thing::fn, thing)(1, 2, 3)","6",(int *)&local_88,
               &local_2c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                 ,0x24,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      gtest_ar._0_8_ = Thing::fn;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,&thing.super___shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>);
      local_40._0_4_ = 1;
      local_6c[0] = 2;
      local_6c[1] = 3;
      local_88.data_._0_4_ =
           lambda::
           bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int&&)
           ::{lambda((auto:1&&)...)#1}::operator()(&gtest_ar,local_6c,local_6c + 1);
      local_6c[2] = 6;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_1,"lmd::bind(&Thing::fn, thing, 1)(2, 3)","6",
                 (int *)&local_88,local_6c + 2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                   ,0x25,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
        gtest_ar._0_8_ = Thing::fn;
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::__shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,&thing.super___shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>);
        local_40 = 0x200000001;
        local_6c[0] = 3;
        local_88.data_._0_4_ =
             lambda::
             bind<int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int,int>(int(Thing::*)(int,int,int),std::shared_ptr<Thing>&,int&&,int&&)
             ::{lambda((auto:1&&)...)#1}::operator()
                       ((_lambda__auto_1________1_ *)&gtest_ar,local_6c);
        local_6c[1] = 6;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_1,"lmd::bind(&Thing::fn, thing, 1, 2)(3)","6",
                   (int *)&local_88,local_6c + 1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar);
          if (gtest_ar_1.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                     ,0x26,pcVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_1.message_);
          gtest_ar._0_8_ = Thing::fn;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          std::__shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_50,&thing.super___shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>);
          local_40 = 0x200000001;
          local_38 = 3;
          local_88.data_._0_4_ =
               anon_class_48_5_21af6246::operator()<>((anon_class_48_5_21af6246 *)&gtest_ar);
          local_6c[0] = 6;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar_1,"lmd::bind(&Thing::fn, thing, 1, 2, 3)()","6",
                     (int *)&local_88,local_6c);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
          if (gtest_ar_1.success_ != false) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_1.message_);
            gtest_ar_1._0_8_ = Thing::cfn;
            gtest_ar_1.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_6c[0] = 1;
            local_6c[1] = 2;
            local_6c[2] = 3;
            local_88.data_._0_4_ =
                 lambda::
                 invoke<int(Thing::*const&)(int,int,int)const,std::shared_ptr<Thing>&,int,int,int>
                           ((offset_in_Thing_to_subr *)&gtest_ar_1,&thing,local_6c,local_6c + 1,
                            local_6c + 2);
            local_2c = 6;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"lmd::bind(&Thing::cfn)(thing, 1, 2, 3)","6",
                       (int *)&local_88,&local_2c);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_1);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_88,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                         ,0x29,pcVar2);
              testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_1);
              testing::internal::AssertHelper::~AssertHelper(&local_88);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar_1);
            }
            pAVar1 = &gtest_ar;
            goto LAB_00138bc8;
          }
          testing::Message::Message((Message *)&gtest_ar);
          if (gtest_ar_1.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                     ,0x27,pcVar2);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar);
        }
      }
    }
    pAVar1 = &gtest_ar_1;
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    this_00 = &gtest_ar;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_00138bc8:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&thing.super___shared_ptr<Thing,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(lambda, bind_mem_fn_smart_ptr) {
    auto thing = std::make_shared<Thing>();

    ASSERT_EQ(lmd::bind(&Thing::fn)(thing, 1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, thing)(1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, thing, 1)(2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, thing, 1, 2)(3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, thing, 1, 2, 3)(), 6);

    ASSERT_EQ(lmd::bind(&Thing::cfn)(thing, 1, 2, 3), 6);
}